

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

void __thiscall
cmsys::RegularExpression::RegularExpression(RegularExpression *this,RegularExpression *rxp)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  
  (this->regmatch).startp[0] = (char *)0x0;
  (this->regmatch).endp[0] = (char *)0x0;
  (this->regmatch).searchstring = (char *)0x0;
  if (rxp->program == (char *)0x0) {
    this->program = (char *)0x0;
  }
  else {
    iVar1 = rxp->progsize;
    this->progsize = iVar1;
    pcVar2 = (char *)operator_new__((long)iVar1);
    this->program = pcVar2;
    uVar3 = (long)iVar1;
    while (uVar3 != 0) {
      this->program[uVar3 - 1] = rxp->program[uVar3 - 1];
      uVar3 = uVar3 - 1;
    }
    memcpy(this,rxp,0xa8);
    pcVar2 = rxp->regmust;
    this->regmust = pcVar2;
    if (pcVar2 != (char *)0x0) {
      this->regmust = this->program + (uint)((int)pcVar2 - *(int *)&rxp->program);
    }
    this->regstart = rxp->regstart;
    this->reganch = rxp->reganch;
    this->regmlen = rxp->regmlen;
  }
  return;
}

Assistant:

RegularExpression::RegularExpression(const RegularExpression& rxp)
{
  if (!rxp.program) {
    this->program = KWSYS_NULLPTR;
    return;
  }
  int ind;
  this->progsize = rxp.progsize;            // Copy regular expression size
  this->program = new char[this->progsize]; // Allocate storage
  for (ind = this->progsize; ind-- != 0;)   // Copy regular expression
    this->program[ind] = rxp.program[ind];
  // Copy pointers into last successful "find" operation
  this->regmatch = rxp.regmatch;
  this->regmust = rxp.regmust; // Copy field
  if (rxp.regmust != KWSYS_NULLPTR) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart; // Copy starting index
  this->reganch = rxp.reganch;   // Copy remaining private data
  this->regmlen = rxp.regmlen;   // Copy remaining private data
}